

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O3

bool __thiscall tinyxml2::XMLText::ShallowEqual(XMLText *this,XMLNode *compare)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar3;
  char *pcVar4;
  undefined4 extraout_var_00;
  char *pcVar5;
  char cVar6;
  long *plVar2;
  
  iVar1 = (*compare->_vptr_XMLNode[7])(compare);
  plVar2 = (long *)CONCAT44(extraout_var,iVar1);
  if (plVar2 != (long *)0x0) {
    lVar3 = (**(code **)(*plVar2 + 0x48))(plVar2);
    if (lVar3 == 0) {
      pcVar4 = StrPair::GetStr((StrPair *)(plVar2 + 3));
    }
    else {
      pcVar4 = (char *)0x0;
    }
    iVar1 = (*(this->super_XMLNode)._vptr_XMLNode[9])(this);
    if (CONCAT44(extraout_var_00,iVar1) == 0) {
      pcVar5 = StrPair::GetStr(&(this->super_XMLNode)._value);
    }
    else {
      pcVar5 = (char *)0x0;
    }
    if (pcVar4 == pcVar5) {
      return true;
    }
    cVar6 = *pcVar4;
    if (cVar6 != '\0') {
      lVar3 = 0;
      do {
        if ((cVar6 != pcVar5[lVar3]) || ((int)lVar3 == 0x7fffffff)) {
          if ((int)lVar3 != 0x7fffffff) {
            return false;
          }
          return true;
        }
        cVar6 = pcVar4[lVar3 + 1];
        lVar3 = lVar3 + 1;
      } while (cVar6 != '\0');
      if ((int)lVar3 == 0x7fffffff) {
        return true;
      }
      pcVar5 = pcVar5 + lVar3;
    }
    if (*pcVar5 == '\0') {
      return true;
    }
  }
  return false;
}

Assistant:

bool XMLText::ShallowEqual( const XMLNode* compare ) const
{
    const XMLText* text = compare->ToText();
    return ( text && XMLUtil::StringEqual( text->Value(), Value() ) );
}